

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QString::fromUtf16(char16_t *unicode,qsizetype size)

{
  long lVar1;
  QByteArrayView ba;
  long in_RDX;
  long in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QStringDecoder toUtf16;
  undefined4 in_stack_ffffffffffffff38;
  Flag in_stack_ffffffffffffff3c;
  EncodedData<QByteArrayView> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  QFlagsStorage<QStringConverterBase::Flag> flags;
  QByteArrayView *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    QString((QString *)0x513aea);
  }
  else {
    this = in_RDI;
    if (in_RDX < 0) {
      QtPrivate::qustrlen((char16_t *)in_stack_ffffffffffffff40);
    }
    flags.i = 1;
    QFlags<QStringConverterBase::Flag>::QFlags
              ((QFlags<QStringConverterBase::Flag> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff3c);
    QStringDecoder::QStringDecoder
              ((QStringDecoder *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,(Flags)flags.i)
    ;
    QByteArrayView::QByteArrayView<char,_true>
              (this,(char *)CONCAT44(flags.i,in_stack_ffffffffffffff48),
               (qsizetype)in_stack_ffffffffffffff40);
    ba.m_data._0_4_ = in_stack_ffffffffffffff48;
    ba.m_size = (qsizetype)in_stack_ffffffffffffff40;
    ba.m_data._4_4_ = flags.i;
    QStringDecoder::operator()
              ((QStringDecoder *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),ba);
    QStringDecoder::EncodedData::operator_cast_to_QString(in_stack_ffffffffffffff40);
    QStringDecoder::~QStringDecoder((QStringDecoder *)0x513bb4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::fromUtf16(const char16_t *unicode, qsizetype size)
{
    if (!unicode)
        return QString();
    if (size < 0)
        size = QtPrivate::qustrlen(unicode);
    QStringDecoder toUtf16(QStringDecoder::Utf16, QStringDecoder::Flag::Stateless);
    return toUtf16(QByteArrayView(reinterpret_cast<const char *>(unicode), size * 2));
}